

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O2

int zt_mem_pool_destroy(zt_mem_pool **pool)

{
  zt_mem_page *pzVar1;
  zt_elist *pzVar2;
  zt_elist *pzVar3;
  zt_mem_pool *pzVar4;
  zt_mem_page *page;
  
  pzVar4 = *pool;
  page = (zt_mem_page *)(pzVar4->page_list).next;
  while( true ) {
    if (page == (zt_mem_page *)&pzVar4->page_list) {
      pzVar2 = (pzVar4->pool_list).prev;
      pzVar3 = (pzVar4->pool_list).next;
      pzVar3->prev = pzVar2;
      pzVar2->next = pzVar3;
      free((*pool)->name);
      (*pool)->name = (char *)0x0;
      free(*pool);
      *pool = (zt_mem_pool *)0x0;
      return 0;
    }
    if (page->num_free_elts < pzVar4->elts_per_page) break;
    pzVar1 = (zt_mem_page *)(page->page_list).next;
    zt_mem_page_destroy(page);
    pzVar4 = *pool;
    page = pzVar1;
  }
  return -1;
}

Assistant:

int
zt_mem_pool_destroy(zt_mem_pool **pool)
{
    zt_elist_t  * tmp;
    zt_elist_t  * ptmp;
    zt_mem_page * page;

    zt_elist_for_each_safe(&(*pool)->page_list, tmp, ptmp) {
        page = zt_elist_data(tmp, zt_mem_page, page_list);

        /* sanity checking */
        if (page->num_free_elts < (*pool)->elts_per_page) {
            return -1;
        } else {
            zt_mem_page_destroy(page);
        }
    }

    zt_elist_remove(&(*pool)->pool_list);

    GLOBAL_zmt.dealloc((*pool)->name);
    (*pool)->name = NULL;

    GLOBAL_zmt.dealloc((*pool));
    *pool = NULL;

    return 0;
}